

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::num_writer::operator()
          (num_writer *this,truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it)

{
  add_thousands_sep<char> thousands_sep;
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> __result;
  char *__first;
  char *in_RCX;
  uint uStack_6c;
  __copy_move<false,false,std::random_access_iterator_tag> local_45 [13];
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> local_38;
  
  __result = *it;
  thousands_sep.sep_.size_ = 1;
  thousands_sep.sep_.data_ = (char *)(this + 8);
  thousands_sep._16_8_ = (ulong)uStack_6c << 0x20;
  __first = internal::format_decimal<unsigned_int,char,fmt::v5::internal::add_thousands_sep<char>>
                      ((char *)local_45,*(uint *)this,*(int *)(this + 4),thousands_sep);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<char*,fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>>
            (&local_38,local_45,__first,in_RCX,__result);
  *(ulong *)((long)&(it->super_truncating_iterator_base<char_*>).limit_ + 1) =
       CONCAT17((undefined1)local_38.super_truncating_iterator_base<char_*>.count_,
                local_38.super_truncating_iterator_base<char_*>.limit_._1_7_);
  *(undefined8 *)((long)&(it->super_truncating_iterator_base<char_*>).count_ + 1) = local_38._17_8_;
  (it->super_truncating_iterator_base<char_*>).out_ =
       local_38.super_truncating_iterator_base<char_*>.out_;
  (it->super_truncating_iterator_base<char_*>).limit_ =
       CONCAT71(local_38.super_truncating_iterator_base<char_*>.limit_._1_7_,
                (undefined1)local_38.super_truncating_iterator_base<char_*>.limit_);
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }